

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O2

void re2::Search_Digits_DFA(int i)

{
  SearchDigits(i,SearchDFA);
  return;
}

Assistant:

void Search_Digits_DFA(int i)         { SearchDigits(i, SearchDFA); }